

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

void __thiscall
cfdcapi_coin_CfCoinSelection_Asset1_Test::~cfdcapi_coin_CfCoinSelection_Asset1_Test
          (cfdcapi_coin_CfCoinSelection_Asset1_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_coin_CfCoinSelection_Asset1_Test((cfdcapi_coin_CfCoinSelection_Asset1_Test *)0x3262a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(cfdcapi_coin, CfCoinSelection_Asset1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> ByteData {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    return ByteData(bytes);
  };

  void* coin_select_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  int64_t tx_fee_amount = 2000;
  double effective_fee_rate = -1;
  double long_term_fee_rate = -1;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  ret = CfdInitializeCoinSelection(
    handle, static_cast<uint32_t>(utxos.size()), 3,
    exp_dummy_asset_ca.GetHex().c_str(), tx_fee_amount,
    effective_fee_rate, long_term_fee_rate, dust_fee_rate,
    knapsack_min_change, &coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, coin_select_handle);

  if (ret == kCfdSuccess) {
    for (int32_t index = 0; index < static_cast<int32_t>(utxos.size()); ++index) {
      const Utxo& utxo = utxos[index];
      ByteData txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddCoinSelectionUtxo(
          handle, coin_select_handle, index,
          Txid(ByteData256(txid.GetBytes())).GetHex().c_str(), utxo.vout,
          utxo.amount,
          convert_to_byte(utxo.asset, sizeof(utxo.asset)).GetHex().c_str(),
          kDescriptor);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 0, 115800000,
         exp_dummy_asset_ca.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 1, 347180040,
        exp_dummy_asset_cb.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 2, 37654100,
        exp_dummy_asset_cc.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle, coin_select_handle, &utxo_fee_amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(9200, utxo_fee_amount);

    int32_t utxo_index = 0;
    std::vector<int32_t> indexes;
    for (uint32_t index = 0; index < utxos.size(); ++index) {
      ret = CfdGetSelectedCoinIndex(
          handle, coin_select_handle, index, &utxo_index);
      EXPECT_EQ(kCfdSuccess, ret);
      if (utxo_index == -1) {
        break;
      }
      indexes.push_back(utxo_index);
    }
    EXPECT_EQ(5, indexes.size());

    if (indexes.size() == 5) {
      EXPECT_EQ(8, indexes[0]);
      EXPECT_EQ(7, indexes[1]);
      EXPECT_EQ(10, indexes[2]);
      EXPECT_EQ(1, indexes[3]);
      EXPECT_EQ(3, indexes[4]);
      /*
      req:
            A,  115800000
            B,  347180050
            C,   37654200
      res:
        8:  B,  346430050
        7:  B,     750000
        10: C,   37654200
        1:  A,   78125000
        3:  A,   39062500
      */
    }

    int64_t amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 0, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(117187500, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 1, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(347180050, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 2, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(37654200, amount);
  }
  ret = CfdFreeCoinSelectionHandle(handle, coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}